

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::descriptor_unittest::FeaturesTest_BadOneofName_Test::TestBody
          (FeaturesTest_BadOneofName_Test *this)

{
  string_view expected_errors;
  string_view expected_errors_00;
  basic_string_view<char,_std::char_traits<char>_> local_70;
  string_view local_60;
  string_view local_50;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  string_view local_30;
  string_view local_20;
  FeaturesTest_BadOneofName_Test *local_10;
  FeaturesTest_BadOneofName_Test *this_local;
  
  local_10 = this;
  ValidationErrorTest::BuildDescriptorMessagesInTestPool((ValidationErrorTest *)this);
  DescriptorPool::EnforceNamingStyle(&(this->super_FeaturesTest).super_FeaturesBaseTest.pool_,true);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_20,"naming1.proto");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_30,
             "\n    edition = \"2024\";\n    package naming1;\n    message GoodMessageName { oneof BadOneofName { int32 x = 1; } }\n  "
            );
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_40,"Oneof name BadOneofName should be lower_snake_case");
  expected_errors._M_str = local_40._M_str;
  expected_errors._M_len = local_40._M_len;
  ValidationErrorTest::ParseAndBuildFileWithErrorSubstr
            ((ValidationErrorTest *)this,local_20,local_30,expected_errors);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_50,"naming2.proto");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_60,
             "\n      edition = \"2024\";\n      package naming2;\n      message GoodMessageName { oneof o_ { int32 x = 1; } }\n      "
            );
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_70,"Oneof name o_ contains style violating underscores");
  expected_errors_00._M_str = local_70._M_str;
  expected_errors_00._M_len = local_70._M_len;
  ValidationErrorTest::ParseAndBuildFileWithErrorSubstr
            ((ValidationErrorTest *)this,local_50,local_60,expected_errors_00);
  return;
}

Assistant:

TEST_F(FeaturesTest, BadOneofName) {
  BuildDescriptorMessagesInTestPool();

  pool_.EnforceNamingStyle(true);

  ParseAndBuildFileWithErrorSubstr(
      "naming1.proto", R"schema(
    edition = "2024";
    package naming1;
    message GoodMessageName { oneof BadOneofName { int32 x = 1; } }
  )schema",
      "Oneof name BadOneofName should be lower_snake_case");

  ParseAndBuildFileWithErrorSubstr(
      "naming2.proto", R"schema(
      edition = "2024";
      package naming2;
      message GoodMessageName { oneof o_ { int32 x = 1; } }
      )schema",
      "Oneof name o_ contains style violating underscores");
}